

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::OP_SetNativeFloatElementI_UInt32
               (Var instance,uint32 aElementIndex,ScriptContext *scriptContext,
               PropertyOperationFlags flags,double dValue)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint64 uVar4;
  uint64 uVar5;
  undefined4 *puVar6;
  Var aElementIndex_00;
  double value;
  
  if ((int)aElementIndex < 0) {
    value = (double)aElementIndex;
    uVar4 = NumberUtilities::ToSpecial(value);
    bVar2 = NumberUtilities::IsNan(value);
    if (bVar2) {
      uVar5 = NumberUtilities::ToSpecial(value);
      if (uVar5 != 0xfff8000000000000) {
        uVar5 = NumberUtilities::ToSpecial(value);
        if (uVar5 != 0x7ff8000000000000) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar6 = 0;
        }
      }
    }
    aElementIndex_00 = (Var)(uVar4 ^ 0xfffc000000000000);
  }
  else {
    aElementIndex_00 = (Var)((ulong)aElementIndex | 0x1000000000000);
  }
  BVar3 = OP_SetNativeFloatElementI(instance,aElementIndex_00,scriptContext,flags,dValue);
  return BVar3;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeFloatElementI_UInt32(
        Var instance,
        uint32 aElementIndex,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags,
        double dValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeFloatElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeFloatElementI_UInt32, Op_SetNativeFloatElementI);
#if FLOATVAR
        return OP_SetNativeFloatElementI(instance, JavascriptNumber::ToVar(aElementIndex, scriptContext), scriptContext, flags, dValue);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_SetNativeFloatElementI(instance, JavascriptNumber::ToVarInPlace(aElementIndex, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext, flags, dValue);
#endif
        JIT_HELPER_END(Op_SetNativeFloatElementI_UInt32);
    }